

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

int __thiscall soplex::SPxSteepPR<double>::selectLeaveX(SPxSteepPR<double> *this,double tol)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  int i;
  int lastIdx;
  double x;
  double best;
  double *fTest;
  double *coWeights_ptr;
  int local_38;
  int local_34;
  double local_28;
  
  pdVar1 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2e6c79);
  SPxSolverBase<double>::fTest(*(SPxSolverBase<double> **)(in_RDI + 0x10));
  pdVar2 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2e6c97);
  pdVar3 = (double *)infinity();
  dVar4 = *pdVar3;
  local_34 = -1;
  local_38 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2e6cdb);
  local_28 = -dVar4;
  while (local_38 = local_38 + -1, -1 < local_38) {
    if ((pdVar2[local_38] < -in_XMM0_Qa) &&
       (dVar4 = steeppr::computePrice<double>(pdVar2[local_38],pdVar1[local_38],in_XMM0_Qa),
       local_28 < dVar4)) {
      local_34 = local_38;
      local_28 = dVar4;
    }
  }
  return local_34;
}

Assistant:

int SPxSteepPR<R>::selectLeaveX(R tol)
{
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();
   const R* fTest         = this->thesolver->fTest().get_const_ptr();
   R best = R(-infinity);
   R x;
   int lastIdx = -1;

   for(int i = this->thesolver->dim() - 1; i >= 0; --i)
   {
      x = fTest[i];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, coWeights_ptr[i], tol);

         if(x > best)
         {
            best = x;
            lastIdx = i;
         }
      }
   }

   return lastIdx;
}